

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O0

void __thiscall TestObject::ClearOne(TestObject *this)

{
  TestObject **ppTVar1;
  int local_1c;
  int i;
  TestObject **data;
  TestObject *this_local;
  
  CheckCookie(this);
  ppTVar1 = GetDataPointer(this);
  local_1c = 0;
  while( true ) {
    if (this->pointerCount <= local_1c) {
      return;
    }
    if (ppTVar1[local_1c] != (TestObject *)0x0) break;
    local_1c = local_1c + 1;
  }
  ppTVar1[local_1c] = (TestObject *)0x0;
  return;
}

Assistant:

void TestObject::ClearOne()
{
    CheckCookie();

    TestObject **data = GetDataPointer();

    for (int i = 0; i < pointerCount; ++i)
    {
        if (data[i] != nullptr/* && IsAligned<64>(data[i])*/)
        {
            // CreateFalseReferenceRandom(data[i]);
            data[i] = nullptr;
            break;
        }
    }
}